

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifLibLut.c
# Opt level: O0

If_LibLut_t * If_LibLutRead(char *FileName)

{
  float *pfVar1;
  float fVar2;
  uint uVar3;
  FILE *__stream;
  char *pcVar4;
  double dVar5;
  uint local_428;
  uint local_424;
  int k;
  int i;
  FILE *pFile;
  If_LibLut_t *p;
  char *pToken;
  char pBuffer [1000];
  char *FileName_local;
  
  __stream = fopen(FileName,"r");
  if (__stream == (FILE *)0x0) {
    Abc_Print(-1,"Cannot open LUT library file \"%s\".\n",FileName);
    FileName_local = (char *)0x0;
  }
  else {
    FileName_local = (char *)malloc(0x1198);
    memset(FileName_local,0,0x1198);
    pcVar4 = Abc_UtilStrsav(FileName);
    *(char **)FileName_local = pcVar4;
    local_424 = 1;
    while (pcVar4 = fgets((char *)&pToken,1000,__stream), pcVar4 != (char *)0x0) {
      pcVar4 = strtok((char *)&pToken," \t\n");
      if ((pcVar4 != (char *)0x0) && (*pcVar4 != '#')) {
        uVar3 = atoi(pcVar4);
        if (local_424 != uVar3) {
          Abc_Print(1,"Error in the LUT library file \"%s\".\n",FileName);
          if (*(long *)FileName_local != 0) {
            free(*(void **)FileName_local);
            *(long *)FileName_local = 0;
          }
          if ((long *)FileName_local != (long *)0x0) {
            free(FileName_local);
          }
          fclose(__stream);
          return (If_LibLut_t *)0x0;
        }
        pcVar4 = strtok((char *)0x0," \t\n");
        dVar5 = atof(pcVar4);
        *(float *)((long)FileName_local + (long)(int)local_424 * 4 + 0x10) = (float)dVar5;
        local_428 = 0;
        while (pcVar4 = strtok((char *)0x0," \t\n"), pcVar4 != (char *)0x0) {
          dVar5 = atof(pcVar4);
          *(float *)((long)FileName_local +
                    (long)(int)local_428 * 4 + (long)(int)local_424 * 0x84 + 0x94) = (float)dVar5;
          local_428 = local_428 + 1;
        }
        if ((int)local_424 < (int)local_428) {
          if (*(long *)FileName_local != 0) {
            free(*(void **)FileName_local);
            *(long *)FileName_local = 0;
          }
          if ((long *)FileName_local != (long *)0x0) {
            free(FileName_local);
          }
          Abc_Print(1,"LUT %d has too many pins (%d). Max allowed is %d.\n",(ulong)local_424,
                    (ulong)local_428,(ulong)local_424);
          fclose(__stream);
          return (If_LibLut_t *)0x0;
        }
        if (1 < (int)local_428) {
          *(undefined4 *)((long)FileName_local + 0xc) = 1;
        }
        if (local_424 == 0x20) {
          if (*(long *)FileName_local != 0) {
            free(*(void **)FileName_local);
            *(long *)FileName_local = 0;
          }
          if ((long *)FileName_local != (long *)0x0) {
            free(FileName_local);
          }
          Abc_Print(1,"Skipping LUTs of size more than %d.\n",0x20);
          fclose(__stream);
          return (If_LibLut_t *)0x0;
        }
        local_424 = local_424 + 1;
      }
    }
    *(uint *)((long)FileName_local + 8) = local_424 - 1;
    if (*(int *)((long)FileName_local + 0xc) == 0) {
      for (local_424 = 1; (int)local_424 <= (int)*(long *)((long)FileName_local + 8);
          local_424 = local_424 + 1) {
        if (*(float *)((long)FileName_local + (long)(int)local_424 * 0x84 + 0x94) <= 0.0) {
          Abc_Print(0,
                    "LUT %d has delay %f. Pin delays should be non-negative numbers. Technology mapping may not work correctly.\n"
                    ,(double)*(float *)((long)FileName_local + (long)(int)local_424 * 0x84 + 0x94),
                    (ulong)local_424);
        }
      }
    }
    else {
      for (local_424 = 1; (int)local_424 <= (int)*(long *)((long)FileName_local + 8);
          local_424 = local_424 + 1) {
        for (local_428 = 0; (int)local_428 < (int)local_424; local_428 = local_428 + 1) {
          if (*(float *)((long)FileName_local +
                        (long)(int)local_428 * 4 + (long)(int)local_424 * 0x84 + 0x94) <= 0.0) {
            Abc_Print(0,
                      "Pin %d of LUT %d has delay %f. Pin delays should be non-negative numbers. Technology mapping may not work correctly.\n"
                      ,(double)*(float *)((long)FileName_local +
                                         (long)(int)local_428 * 4 +
                                         (long)(int)local_424 * 0x84 + 0x94),(ulong)local_428,
                      (ulong)local_424);
          }
          if ((local_428 != 0) &&
             (fVar2 = *(float *)((long)FileName_local +
                                (long)(int)(local_428 - 1) * 4 + (long)(int)local_424 * 0x84 + 0x94)
             , pfVar1 = (float *)((long)FileName_local +
                                 (long)(int)local_428 * 4 + (long)(int)local_424 * 0x84 + 0x94),
             *pfVar1 <= fVar2 && fVar2 != *pfVar1)) {
            Abc_Print(0,
                      "Pin %d of LUT %d has delay %f. Pin %d of LUT %d has delay %f. Pin delays should be in non-decreasing order. Technology mapping may not work correctly.\n"
                      ,(double)*(float *)((long)FileName_local +
                                         (long)(int)(local_428 - 1) * 4 +
                                         (long)(int)local_424 * 0x84 + 0x94),
                      (double)*(float *)((long)FileName_local +
                                        (long)(int)local_428 * 4 +
                                        (long)(int)local_424 * 0x84 + 0x94),(ulong)(local_428 - 1),
                      (ulong)local_424,(ulong)local_428,(ulong)local_424);
          }
        }
      }
    }
    fclose(__stream);
  }
  return (If_LibLut_t *)FileName_local;
}

Assistant:

If_LibLut_t * If_LibLutRead( char * FileName )
{
    char pBuffer[1000], * pToken;
    If_LibLut_t * p;
    FILE * pFile;
    int i, k;

    pFile = fopen( FileName, "r" );
    if ( pFile == NULL )
    {
        Abc_Print( -1, "Cannot open LUT library file \"%s\".\n", FileName );
        return NULL;
    }

    p = ABC_ALLOC( If_LibLut_t, 1 );
    memset( p, 0, sizeof(If_LibLut_t) );
    p->pName = Abc_UtilStrsav( FileName );

    i = 1;
    while ( fgets( pBuffer, 1000, pFile ) != NULL )
    {
        pToken = strtok( pBuffer, " \t\n" );
        if ( pToken == NULL )
            continue;
        if ( pToken[0] == '#' )
            continue;
        if ( i != atoi(pToken) )
        {
            Abc_Print( 1, "Error in the LUT library file \"%s\".\n", FileName );
            ABC_FREE( p->pName );
            ABC_FREE( p );
            fclose( pFile );
            return NULL;
        }

        // read area
        pToken = strtok( NULL, " \t\n" );
        p->pLutAreas[i] = (float)atof(pToken);

        // read delays
        k = 0;
        while ( (pToken = strtok( NULL, " \t\n" )) )
            p->pLutDelays[i][k++] = (float)atof(pToken);

        // check for out-of-bound
        if ( k > i )
        {
            ABC_FREE( p->pName );
            ABC_FREE( p );
            Abc_Print( 1, "LUT %d has too many pins (%d). Max allowed is %d.\n", i, k, i );
            fclose( pFile );
            return NULL;
        }

        // check if var delays are specified
        if ( k > 1 )
            p->fVarPinDelays = 1;

        if ( i == IF_MAX_LUTSIZE )
        {
            ABC_FREE( p->pName );
            ABC_FREE( p );
            Abc_Print( 1, "Skipping LUTs of size more than %d.\n", i );
            fclose( pFile );
            return NULL;
        }
        i++;
    }
    p->LutMax = i-1;

    // check the library
    if ( p->fVarPinDelays )
    {
        for ( i = 1; i <= p->LutMax; i++ )
            for ( k = 0; k < i; k++ )
            {
                if ( p->pLutDelays[i][k] <= 0.0 )
                    Abc_Print( 0, "Pin %d of LUT %d has delay %f. Pin delays should be non-negative numbers. Technology mapping may not work correctly.\n", 
                        k, i, p->pLutDelays[i][k] );
                if ( k && p->pLutDelays[i][k-1] > p->pLutDelays[i][k] )
                    Abc_Print( 0, "Pin %d of LUT %d has delay %f. Pin %d of LUT %d has delay %f. Pin delays should be in non-decreasing order. Technology mapping may not work correctly.\n", 
                        k-1, i, p->pLutDelays[i][k-1], 
                        k, i, p->pLutDelays[i][k] );
            }
    }
    else
    {
        for ( i = 1; i <= p->LutMax; i++ )
        {
            if ( p->pLutDelays[i][0] <= 0.0 )
                Abc_Print( 0, "LUT %d has delay %f. Pin delays should be non-negative numbers. Technology mapping may not work correctly.\n", 
                    i, p->pLutDelays[i][0] );
        }
    }

    fclose( pFile );
    return p;
}